

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O3

void __thiscall HighsDomain::ConflictSet::pushQueue(ConflictSet *this,iterator domchg)

{
  _Rb_tree_color _Var1;
  iterator __position;
  pointer p_Var2;
  _Base_ptr p_Var3;
  bool bVar4;
  long lVar5;
  pointer p_Var6;
  long lVar7;
  _Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg> local_18;
  
  __position._M_current =
       (this->resolveQueue).
       super__Vector_base<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->resolveQueue).
      super__Vector_base<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_18._M_node = domchg._M_node;
    std::
    vector<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>>>
    ::_M_realloc_insert<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>&>
              ((vector<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>>>
                *)&this->resolveQueue,__position,&local_18);
    p_Var6 = (this->resolveQueue).
             super__Vector_base<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (__position._M_current)->_M_node = domchg._M_node;
    p_Var6 = (this->resolveQueue).
             super__Vector_base<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->resolveQueue).
    super__Vector_base<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = p_Var6;
  }
  p_Var2 = (this->resolveQueue).
           super__Vector_base<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  p_Var3 = p_Var6[-1]._M_node;
  lVar7 = (long)p_Var6 - (long)p_Var2 >> 3;
  lVar5 = lVar7 + -1;
  if (1 < lVar7) {
    _Var1 = p_Var3[1]._M_color;
    do {
      lVar7 = (lVar5 - (lVar5 + -1 >> 0x3f)) + -1 >> 1;
      if ((int)_Var1 <= (int)p_Var2[lVar7]._M_node[1]._M_color) break;
      p_Var2[lVar5]._M_node = p_Var2[lVar7]._M_node;
      bVar4 = 2 < lVar5;
      lVar5 = lVar7;
    } while (bVar4);
  }
  p_Var2[lVar5]._M_node = p_Var3;
  return;
}

Assistant:

void HighsDomain::ConflictSet::pushQueue(
    std::set<LocalDomChg>::iterator domchg) {
  resolveQueue.emplace_back(domchg);
  std::push_heap(
      resolveQueue.begin(), resolveQueue.end(),
      [](const std::set<LocalDomChg>::iterator& a,
         const std::set<LocalDomChg>::iterator& b) { return a->pos < b->pos; });
}